

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4SubClampPalCommand::Execute
          (DrawColumnRt4SubClampPalCommand *this,DrawerThread *thread)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint32_t b;
  uint32_t a;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int count;
  int pitch;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  DrawerThread *thread_local;
  DrawColumnRt4SubClampPalCommand *this_local;
  
  fg2rgb._0_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalRtCommand).yl,
                            ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)fg2rgb) {
    puVar1 = (this->super_PalRtCommand)._srcblend;
    puVar2 = (this->super_PalRtCommand)._destblend;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _count = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar5 + iVar4) * 4) + (this->super_PalRtCommand).sx);
    puVar3 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar3 + (iVar5 << 2);
    iVar5 = (this->super_PalRtCommand)._pitch;
    iVar4 = thread->num_cores;
    puVar3 = (this->super_PalRtCommand)._colormap;
    do {
      uVar6 = (puVar1[puVar3[*dest]] | 0x40100400) - puVar2[*_count];
      uVar7 = uVar6 & 0x40100400;
      uVar6 = uVar7 - (uVar7 >> 5) & uVar6 | 0x1f07c1f;
      *_count = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = (puVar1[puVar3[dest[1]]] | 0x40100400) - puVar2[_count[1]];
      uVar7 = uVar6 & 0x40100400;
      uVar6 = uVar7 - (uVar7 >> 5) & uVar6 | 0x1f07c1f;
      _count[1] = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = (puVar1[puVar3[dest[2]]] | 0x40100400) - puVar2[_count[2]];
      uVar7 = uVar6 & 0x40100400;
      uVar6 = uVar7 - (uVar7 >> 5) & uVar6 | 0x1f07c1f;
      _count[2] = RGB32k.All[uVar6 >> 0xf & uVar6];
      uVar6 = (puVar1[puVar3[dest[3]]] | 0x40100400) - puVar2[_count[3]];
      uVar7 = uVar6 & 0x40100400;
      uVar6 = uVar7 - (uVar7 >> 5) & uVar6 | 0x1f07c1f;
      _count[3] = RGB32k.All[uVar6 >> 0xf & uVar6];
      dest = dest + 4;
      _count = _count + iVar5 * iVar4;
      fg2rgb._0_4_ = (int)fg2rgb + -1;
    } while ((int)fg2rgb != 0);
  }
  return;
}

Assistant:

void DrawColumnRt4SubClampPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t a = (fg2rgb[colormap[source[0]]] | 0x40100400) - bg2rgb[dest[0]];
			uint32_t b = a;

			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[0] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[1]]] | 0x40100400) - bg2rgb[dest[1]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[1] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[2]]] | 0x40100400) - bg2rgb[dest[2]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[2] = RGB32k.All[(a>>15) & a];

			a = (fg2rgb[colormap[source[3]]] | 0x40100400) - bg2rgb[dest[3]];
			b = a;
			b &= 0x40100400;
			b = b - (b >> 5);
			a &= b;
			a |= 0x01f07c1f;
			dest[3] = RGB32k.All[(a>>15) & a];

			source += 4;
			dest += pitch;
		} while (--count);
	}